

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForScalarVectorField
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_prefix_ptr,
          string *code_ptr)

{
  bool bVar1;
  string local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  string local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  string local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined4 local_4d4;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  Type vectortype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string struct_type;
  undefined1 local_80 [8];
  string field_method;
  string field_field;
  string *code_prefix;
  string *code;
  string *code_ptr_local;
  string *code_prefix_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>((string *)local_80,&(this->namer_).super_Namer,field);
  IdlNamer::Type_abi_cxx11_((string *)local_b0,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_130,this,2);
  std::operator+(&local_110,&local_130,"if self.");
  std::operator+(&local_f0,&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_d0,&local_f0," is not None:");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  GenIndents_abi_cxx11_(&local_210,this,3);
  std::operator+(&local_1f0,&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::operator+(&local_1d0,&local_1f0,"Add");
  std::operator+(&local_1b0,&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::operator+(&local_190,&local_1b0,"(builder, ");
  std::operator+(&local_170,&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_150,&local_170,")");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  GenIndents_abi_cxx11_((string *)&vectortype.fixed_length,this,2);
  std::operator+(&local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vectortype.fixed_length,"if self.");
  std::operator+(&local_250,&local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_230,&local_250," is not None:");
  std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&vectortype.fixed_length);
  Type::VectorType((Type *)local_2b0,&(field->value).type);
  bVar1 = IsString((Type *)local_2b0);
  if (bVar1) {
    GenIndents_abi_cxx11_(&local_310,this,3);
    std::operator+(&local_2f0,&local_310,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_2d0,&local_2f0,"list = []");
    std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    GenIndents_abi_cxx11_(&local_390,this,3);
    std::operator+(&local_370,&local_390,"for i in range(len(self.");
    std::operator+(&local_350,&local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_330,&local_350,")):");
    std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    GenIndents_abi_cxx11_(&local_430,this,4);
    std::operator+(&local_410,&local_430,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_3f0,&local_410,"list.append(builder.CreateString(self.");
    std::operator+(&local_3d0,&local_3f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_3b0,&local_3d0,"[i]))");
    std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    GenPackForScalarVectorFieldHelper(this,struct_def,field,code_prefix_ptr,3);
    std::operator+(&local_470,"(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_450,&local_470,"list[i])");
    std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    GenIndents_abi_cxx11_(&local_4d0,this,3);
    std::operator+(&local_4b0,&local_4d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_490,&local_4b0," = builder.EndVector()");
    std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    local_4d4 = 1;
  }
  else {
    if (((((this->super_BaseGenerator).parser_)->opts).python_gen_numpy & 1U) == 0) {
      GenPackForScalarVectorFieldHelper(this,struct_def,field,code_prefix_ptr,3);
      std::operator+(&local_718,"(self.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_6f8,&local_718,"[i])");
      std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      GenIndents_abi_cxx11_(&local_778,this,4);
      std::operator+(&local_758,&local_778,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_738,&local_758," = builder.EndVector()");
      std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_738);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_778);
    }
    else {
      GenIndents_abi_cxx11_(&local_558,this,3);
      std::operator+(&local_538,&local_558,"if np is not None and type(self.");
      std::operator+(&local_518,&local_538,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_4f8,&local_518,") is np.ndarray:");
      std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_558);
      GenIndents_abi_cxx11_(&local_5f8,this,4);
      std::operator+(&local_5d8,&local_5f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_5b8,&local_5d8," = builder.CreateNumpyVector(self.");
      std::operator+(&local_598,&local_5b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_578,&local_598,")");
      std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_578);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5f8);
      GenIndents_abi_cxx11_(&local_638,this,3);
      std::operator+(&local_618,&local_638,"else:");
      std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_638);
      GenPackForScalarVectorFieldHelper(this,struct_def,field,code_prefix_ptr,4);
      std::operator+(&local_678,"(self.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_658,&local_678,"[i])");
      std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_658);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_678);
      GenIndents_abi_cxx11_(&local_6d8,this,4);
      std::operator+(&local_6b8,&local_6d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_698,&local_6b8," = builder.EndVector()");
      std::__cxx11::string::operator+=((string *)code_prefix_ptr,(string *)&local_698);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6d8);
    }
    local_4d4 = 0;
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenPackForScalarVectorField(const StructDef &struct_def,
                                   const FieldDef &field,
                                   std::string *code_prefix_ptr,
                                   std::string *code_ptr) const {
    auto &code = *code_ptr;
    auto &code_prefix = *code_prefix_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);

    // Adds the field into the struct.
    code += GenIndents(2) + "if self." + field_field + " is not None:";
    code += GenIndents(3) + struct_type + "Add" + field_method + "(builder, " +
            field_field + ")";

    // Creates the field.
    code_prefix += GenIndents(2) + "if self." + field_field + " is not None:";
    // If the vector is a string vector, we need to first build accessor for
    // each string element. And this generated code, needs to be
    // placed ahead of code_prefix.
    auto vectortype = field.value.type.VectorType();
    if (IsString(vectortype)) {
      code_prefix += GenIndents(3) + field_field + "list = []";
      code_prefix +=
          GenIndents(3) + "for i in range(len(self." + field_field + ")):";
      code_prefix += GenIndents(4) + field_field +
                     "list.append(builder.CreateString(self." + field_field +
                     "[i]))";
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 3);
      code_prefix += "(" + field_field + "list[i])";
      code_prefix += GenIndents(3) + field_field + " = builder.EndVector()";
      return;
    }

    if (parser_.opts.python_gen_numpy) {
      code_prefix += GenIndents(3) + "if np is not None and type(self." +
                    field_field + ") is np.ndarray:";
      code_prefix += GenIndents(4) + field_field +
                    " = builder.CreateNumpyVector(self." + field_field + ")";
      code_prefix += GenIndents(3) + "else:";
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 4);
      code_prefix += "(self." + field_field + "[i])";
      code_prefix += GenIndents(4) + field_field + " = builder.EndVector()";
    } else {
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 3);
      code_prefix += "(self." + field_field + "[i])";
      code_prefix += GenIndents(4) + field_field + " = builder.EndVector()";
    }
  }